

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O3

void reveal_in_browser(Fl_Type *t)

{
  Fl_Type *pFVar1;
  Fl_Type *p;
  
  pFVar1 = t->parent;
  if (t->parent != (Fl_Type *)0x0) {
    do {
      p = pFVar1;
      if (p->open_ == '\0') {
        p->open_ = '\x01';
      }
      pFVar1 = p->parent;
    } while (p->parent != (Fl_Type *)0x0);
    fixvisible(p);
  }
  Fl_Browser_::display(&widget_browser->super_Fl_Browser_,t);
  Fl_Widget::redraw((Fl_Widget *)widget_browser);
  return;
}

Assistant:

void reveal_in_browser(Fl_Type *t) {
  Fl_Type *p = t->parent;
  if (p) {
    for (;;) {
      if (!p->open_)
        p->open_ = 1;
      if (!p->parent) break;
      p = p->parent;
    }
    fixvisible(p);
  }
  widget_browser->display(t);
  redraw_browser();
}